

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall
QFontCache::insertEngineData(QFontCache *this,QFontDef *def,QFontEngineData *engineData)

{
  long lVar1;
  size_type_conflict sVar2;
  iterator iVar3;
  QFontCache *in_RSI;
  QMap<QFontDef,_QFontEngineData_*> *in_RDI;
  long in_FS_OFFSET;
  QFontCache *in_stack_00000048;
  QFontDef *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x717f19);
  if (0x2000 < *(uint *)&in_RDI[5].d.d.ptr) {
    sVar2 = QMap<QFontDef,_QFontEngineData_*>::size(in_RDI);
    if (0xff < sVar2) {
      decreaseCache(in_stack_00000048);
    }
  }
  iVar3 = QMap<QFontDef,_QFontEngineData_*>::insert
                    ((QMap<QFontDef,_QFontEngineData_*> *)in_RSI,in_stack_ffffffffffffffd8,
                     (QFontEngineData **)in_RDI);
  increaseCost(in_RSI,iVar3.i._M_node._4_4_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontCache::insertEngineData(const QFontDef &def, QFontEngineData *engineData)
{
#ifdef QFONTCACHE_DEBUG
    FC_DEBUG("QFontCache: inserting new engine data %p", engineData);
    if (engineDataCache.contains(def)) {
        FC_DEBUG("   QFontCache already contains engine data %p for key=(%g %g %d %d %d)",
                 engineDataCache.value(def), def.pointSize,
                 def.pixelSize, def.weight, def.style, def.fixedPitch);
    }
#endif
    Q_ASSERT(!engineDataCache.contains(def));

    engineData->ref.ref();
    // Decrease now rather than waiting
    if (total_cost > min_cost * 2 && engineDataCache.size() >= QFONTCACHE_DECREASE_TRIGGER_LIMIT)
        decreaseCache();

    engineDataCache.insert(def, engineData);
    increaseCost(sizeof(QFontEngineData));
}